

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtQuantizedBvhNode>::initializeFromBuffer
          (cbtAlignedObjectArray<cbtQuantizedBvhNode> *this,void *buffer,int size,int capacity)

{
  if (this->m_data != (cbtQuantizedBvhNode *)0x0) {
    if (this->m_ownsMemory == true) {
      cbtAlignedFreeInternal(this->m_data);
    }
    this->m_data = (cbtQuantizedBvhNode *)0x0;
  }
  this->m_ownsMemory = false;
  this->m_data = (cbtQuantizedBvhNode *)buffer;
  this->m_size = size;
  this->m_capacity = capacity;
  return;
}

Assistant:

void initializeFromBuffer(void* buffer, int size, int capacity)
	{
		clear();
		m_ownsMemory = false;
		m_data = (T*)buffer;
		m_size = size;
		m_capacity = capacity;
	}